

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O2

void henson_load_array(char *name,void **address,size_t *type,size_t *count,size_t *stride)

{
  NameMap *this;
  Array *pAVar1;
  void *pvVar2;
  allocator local_c9;
  string local_c8;
  data_t local_a8;
  undefined8 uStack_a0;
  size_t local_98;
  size_t sStack_90;
  size_t local_88;
  element_type *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_78 [2];
  Value local_68;
  
  this = namemap;
  if (namemap != (NameMap *)0x0) {
    std::__cxx11::string::string((string *)&local_c8,name,&local_c9);
    henson::NameMap::get(&local_68,this,&local_c8);
    pAVar1 = mpark::detail::
             generic_get<5ul,mpark::variant<int,unsigned_long,void*,float,double,henson::Array,std::__cxx11::string>>
                       (&local_68);
    local_88 = pAVar1->stride;
    local_a8.head_.value =
         *(alt<0UL,_void_*> *)
          &(pAVar1->address).impl_.
           super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
           .
           super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
           .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
           super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
           .
           super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
    ;
    uStack_a0 = *(undefined8 *)
                 ((long)&(pAVar1->address).impl_.
                         super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                         .
                         super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                         .
                         super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>
                         .
                         super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                         .
                         super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                 + 8);
    local_98 = pAVar1->type;
    sStack_90 = pAVar1->count;
    local_80 = (pAVar1->storage).
               super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    a_Stack_78[0]._M_pi =
         (pAVar1->storage).
         super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    (pAVar1->storage).
    super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pAVar1->storage).
    super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    mpark::detail::
    destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
    ::destroy((destructor<mpark::detail::traits<int,_unsigned_long,_void_*,_float,_double,_henson::Array,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(mpark::detail::Trait)1>
               *)&local_68);
    std::__cxx11::string::~string((string *)&local_c8);
    pvVar2 = henson::Array::void_ptr((Array *)&local_a8.head_);
    *address = pvVar2;
    *type = local_98;
    *count = sStack_90;
    *stride = local_88;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_78);
  }
  return;
}

Assistant:

void
henson_load_array(const char* name, void** address, size_t* type, size_t* count, size_t* stride)
{
    if (!namemap) return;

    henson::Array a = henson::get<henson::Array>(namemap->get(name));
    *address = a.void_ptr();
    *type    = a.type;
    *count   = a.count;
    *stride  = a.stride;
}